

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O0

ActionResults * __thiscall AbstractRoomAction::Pick(AbstractRoomAction *this)

{
  ItemTable *pIVar1;
  bool bVar2;
  bool bVar3;
  itemType iVar4;
  itemLocation iVar5;
  ItemWrapper *pIVar6;
  string local_150 [36];
  itemType local_12c;
  undefined1 local_128 [68];
  itemType local_e4;
  itemType local_e0;
  itemType local_dc;
  Item local_d8;
  undefined1 local_b0 [64];
  undefined4 local_70;
  undefined1 local_69;
  string local_68 [32];
  itemType local_48 [4];
  string local_38 [8];
  string information;
  AbstractRoomAction *this_local;
  
  std::__cxx11::string::string(local_38);
  iVar4 = Command::getMainItem(this->commands);
  bVar2 = itemInRoom(this,iVar4);
  bVar3 = true;
  if (bVar2) {
    pIVar1 = this->itemList;
    local_48[0] = Command::getMainItem(this->commands);
    pIVar6 = ItemTable::getValue(pIVar1,local_48);
    iVar5 = ItemWrapper::getLocation(pIVar6);
    bVar3 = iVar5 == BACKPACK;
  }
  if (bVar3) {
    std::__cxx11::string::operator=
              (local_38,
               "You can not pick up an item that is not in the room or is already in your backpack."
              );
    this_local = (AbstractRoomAction *)operator_new(0x30);
    local_69 = 1;
    std::__cxx11::string::string(local_68,local_38);
    ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_68);
    local_69 = 0;
    std::__cxx11::string::~string(local_68);
    goto LAB_00121a72;
  }
  iVar4 = Command::getMainItem(this->commands);
  if ((iVar4 - FOX_TOKEN < 2) || (iVar4 == GOOSE_TOKEN)) {
    bVar3 = hasAToken(this);
    if (!bVar3) {
      iVar4 = Command::getMainItem(this->commands);
      bVar3 = itemInRoom(this,iVar4);
      if (bVar3) {
        pIVar1 = this->itemList;
        local_dc = Command::getMainItem(this->commands);
        pIVar6 = ItemTable::getValue(pIVar1,&local_dc);
        ItemWrapper::getItem(&local_d8,pIVar6);
        Item::getName_abi_cxx11_((Item *)local_b0);
        std::operator+(local_b0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "You pick up the the ");
        std::__cxx11::string::operator=(local_38,(string *)(local_b0 + 0x20));
        std::__cxx11::string::~string((string *)(local_b0 + 0x20));
        std::__cxx11::string::~string((string *)local_b0);
        Item::~Item(&local_d8);
        pIVar1 = this->itemList;
        local_e0 = Command::getMainItem(this->commands);
        pIVar6 = ItemTable::getValue(pIVar1,&local_e0);
        ItemWrapper::setLocation(pIVar6,BACKPACK);
        goto LAB_001219c6;
      }
    }
    std::__cxx11::string::operator=(local_38,"Only one token allowed to be picked up at a time.");
  }
  else {
    iVar4 = Command::getMainItem(this->commands);
    bVar3 = itemInRoom(this,iVar4);
    if (bVar3) {
      pIVar1 = this->itemList;
      local_e4 = Command::getMainItem(this->commands);
      pIVar6 = ItemTable::getValue(pIVar1,&local_e4);
      ItemWrapper::setLocation(pIVar6,BACKPACK);
      pIVar1 = this->itemList;
      local_12c = Command::getMainItem(this->commands);
      ItemTable::getValue(pIVar1,&local_12c);
      ItemWrapper::getItemName_abi_cxx11_((ItemWrapper *)local_128);
      std::operator+(local_128 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "You pick up the ");
      std::__cxx11::string::operator=(local_38,(string *)(local_128 + 0x20));
      std::__cxx11::string::~string((string *)(local_128 + 0x20));
      std::__cxx11::string::~string((string *)local_128);
    }
    else {
      std::__cxx11::string::operator=(local_38,"You cant pick up an item that is not here.");
    }
  }
LAB_001219c6:
  this_local = (AbstractRoomAction *)operator_new(0x30);
  std::__cxx11::string::string(local_150,local_38);
  ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_150);
  std::__cxx11::string::~string(local_150);
LAB_00121a72:
  local_70 = 1;
  std::__cxx11::string::~string(local_38);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * AbstractRoomAction::Pick() {
    std::string information;

    if (!itemInRoom(commands->getMainItem()) ||
        itemList->getValue(commands->getMainItem())->getLocation()
        == BACKPACK) {
        information = "You can not pick up an item that is not in the room or is already in your backpack.";
        return new ActionResults(CURRENT, information);

    }

    switch (commands->getMainItem()) {
        case FOX_TOKEN :
        case GOOSE_TOKEN :
        case BEAN_TOKEN :
            if (!hasAToken() && itemInRoom(commands->getMainItem())) {
                information = "You pick up the the " +
                              itemList->getValue(commands->getMainItem())->getItem().getName();
                itemList->getValue(commands->getMainItem())->setLocation(BACKPACK);
            } else {
                information = "Only one token allowed to be picked up at a time.";
            }
            break;
        default:
            if (itemInRoom(commands->getMainItem())) {
                itemList->getValue(commands->getMainItem())->setLocation(BACKPACK);
                information = "You pick up the " + itemList->getValue(commands->getMainItem())->getItemName();
            } else {
                information = "You cant pick up an item that is not here.";
            }
            break;
    }

    return new ActionResults(CURRENT, information);
}